

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  long lVar2;
  CustomDataSource *in_RDI;
  size_t size;
  int i;
  void **elements;
  int n;
  Arena *in_stack_ffffffffffffffc8;
  int local_1c;
  
  lVar2._0_4_ = in_RDI->_has_bits_;
  lVar2._4_4_ = in_RDI->_cached_size_;
  if ((lVar2 != 0) &&
     ((in_RDI->super_Message).super_MessageLite._vptr_MessageLite == (_func_int **)0x0)) {
    iVar1 = **(int **)&in_RDI->_has_bits_;
    lVar2 = *(long *)&in_RDI->_has_bits_;
    for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
      cast<google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::TypeHandler>
                (*(void **)(lVar2 + 8 + (long)local_1c * 8));
      GenericTypeHandler<bloaty::CustomDataSource>::Delete(in_RDI,in_stack_ffffffffffffffc8);
    }
    operator_delete(*(void **)&in_RDI->_has_bits_,
                    (long)*(int *)((long)&(in_RDI->_internal_metadata_).
                                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                          .ptr_ + 4) * 8 + 8);
  }
  in_RDI->_has_bits_ = (uint32  [1])0x0;
  in_RDI->_cached_size_ = (atomic<int>)0x0;
  return;
}

Assistant:

void RepeatedPtrFieldBase::Destroy() {
  if (rep_ != NULL && arena_ == NULL) {
    int n = rep_->allocated_size;
    void* const* elements = rep_->elements;
    for (int i = 0; i < n; i++) {
      TypeHandler::Delete(cast<TypeHandler>(elements[i]), NULL);
    }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
    const size_t size = total_size_ * sizeof(elements[0]) + kRepHeaderSize;
    ::operator delete(static_cast<void*>(rep_), size);
#else
    ::operator delete(static_cast<void*>(rep_));
#endif
  }
  rep_ = NULL;
}